

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCommand.h
# Opt level: O2

void __thiscall PrintCommand::~PrintCommand(PrintCommand *this)

{
  (this->super_Command)._vptr_Command = (_func_int **)&PTR_execute_00114880;
  std::__cxx11::string::~string((string *)&this->message);
  return;
}

Assistant:

~PrintCommand() override = default;